

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 local_c0 [8];
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  char zBuf [100];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  x._40_8_ = argv;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_c0);
  if (iVar1 == 0) {
    computeYMD_HMS((DateTime *)local_c0);
    sqlite3_snprintf(100,(char *)&context_local,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(uint)x.iJD,
                     (ulong)x.iJD._4_4_,(ulong)(uint)x.Y,x.M,x.D,(int)(double)x._24_8_);
    sqlite3_result_text(context,(char *)&context_local,-1,(_func_void_void_ptr *)0xffffffffffffffff)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeYMD_HMS(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%04d-%02d-%02d %02d:%02d:%02d",
                     x.Y, x.M, x.D, x.h, x.m, (int)(x.s));
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}